

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctf-2-json-val-req.cpp
# Opt level: O3

void __thiscall yactfr::internal::JsonDstFragValReq::JsonDstFragValReq(JsonDstFragValReq *this)

{
  JsonAnyFullDtValReq *anyFullDtValReq;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  char *pcVar1;
  bool isRequired;
  bool isRequired_00;
  long lVar2;
  undefined1 allowNull;
  undefined8 in_stack_fffffffffffffd18;
  undefined1 local_2d7;
  undefined1 local_2d6;
  undefined1 local_2d5;
  allocator local_2d4;
  allocator local_2d3;
  allocator local_2d2;
  allocator local_2d1;
  type in_stack_fffffffffffffd30;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_2c8;
  string local_2c0;
  string local_2a0;
  string local_280;
  string local_260;
  JsonObjValPropReq local_240;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_yactfr::internal::JsonObjValPropReq>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_yactfr::internal::JsonObjValPropReq>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_228;
  undefined1 local_1f0 [56];
  PropReqsEntry local_1b8;
  PropReqsEntry local_180 [2];
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_yactfr::internal::JsonObjValPropReq>
  local_110;
  PropReqsEntry local_d8;
  PropReqsEntry local_a0;
  PropReqsEntry local_68;
  
  allowNull = (undefined1)((ulong)in_stack_fffffffffffffd18 >> 0x30);
  (this->super_JsonFragValReq).super_JsonObjValReq.super_JsonValReq._vptr_JsonValReq =
       (_func_int **)&PTR__JsonDstFragValReq_002fcbf8;
  std::__cxx11::string::string((string *)&local_260,"data-stream-class",&local_2d1);
  (anonymous_namespace)::nsPropReqEntry_abi_cxx11_();
  (anonymous_namespace)::namePropReqEntry_abi_cxx11_
            (&local_1b8,(_anonymous_namespace_ *)0x0,isRequired);
  (anonymous_namespace)::uidPropReqEntry_abi_cxx11_
            (local_180,(_anonymous_namespace_ *)0x0,isRequired_00);
  (anonymous_namespace)::idPropReqEntry_abi_cxx11_();
  JsonValReq::shared((optional<yactfr::internal::JsonValKind>)in_stack_fffffffffffffd30,
                     (bool)allowNull);
  JsonObjValPropReq::JsonObjValPropReq(&local_240,(Sp *)&stack0xfffffffffffffd30,false);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_yactfr::internal::JsonObjValPropReq>
  ::pair<const_char_*const_&,_true>(&local_110,&strs::defCcId,&local_240);
  std::__cxx11::string::string((string *)&local_280,"packet-context-field-class",&local_2d2);
  anyFullDtValReq = &this->_anyFullDtValReq;
  anon_unknown_0::anyDtPropReqEntry(&local_d8,&local_280,anyFullDtValReq,false);
  std::__cxx11::string::string((string *)&local_2a0,"event-record-header-field-class",&local_2d3);
  anon_unknown_0::anyDtPropReqEntry(&local_a0,&local_2a0,anyFullDtValReq,false);
  std::__cxx11::string::string
            ((string *)&local_2c0,"event-record-common-context-field-class",&local_2d4);
  anon_unknown_0::anyDtPropReqEntry(&local_68,&local_2c0,anyFullDtValReq,false);
  std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,yactfr::internal::JsonObjValPropReq>,std::allocator<std::pair<std::__cxx11::string_const,yactfr::internal::JsonObjValPropReq>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::_Hashtable<std::pair<std::__cxx11::string_const,yactfr::internal::JsonObjValPropReq>const*>
            ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,yactfr::internal::JsonObjValPropReq>,std::allocator<std::pair<std::__cxx11::string_const,yactfr::internal::JsonObjValPropReq>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)&local_228,local_1f0,&stack0xffffffffffffffd0,0,&local_2d5,&local_2d6,&local_2d7);
  JsonFragValReq::JsonFragValReq(&this->super_JsonFragValReq,&local_260,(PropReqs *)&local_228);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_yactfr::internal::JsonObjValPropReq>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_yactfr::internal::JsonObjValPropReq>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&local_228);
  lVar2 = 0;
  do {
    this_00 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
               ((long)&local_68.second._valReq.
                       super___shared_ptr<const_yactfr::internal::JsonValReq,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi + lVar2);
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    }
    pcVar1 = *(char **)((long)&local_68.first._M_dataplus._M_p + lVar2);
    if (local_68.first.field_2._M_local_buf + lVar2 != pcVar1) {
      operator_delete(pcVar1,*(long *)((long)&local_68.first.field_2 + lVar2) + 1);
    }
    lVar2 = lVar2 + -0x38;
  } while (lVar2 != -0x1c0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2c0._M_dataplus._M_p != &local_2c0.field_2) {
    operator_delete(local_2c0._M_dataplus._M_p,local_2c0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a0._M_dataplus._M_p != &local_2a0.field_2) {
    operator_delete(local_2a0._M_dataplus._M_p,local_2a0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_280._M_dataplus._M_p != &local_280.field_2) {
    operator_delete(local_280._M_dataplus._M_p,local_280.field_2._M_allocated_capacity + 1);
  }
  if (local_240._valReq.
      super___shared_ptr<const_yactfr::internal::JsonValReq,_(__gnu_cxx::_Lock_policy)2>._M_refcount
      ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_240._valReq.
               super___shared_ptr<const_yactfr::internal::JsonValReq,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_2c8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_2c8._M_pi);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_260._M_dataplus._M_p != &local_260.field_2) {
    operator_delete(local_260._M_dataplus._M_p,local_260.field_2._M_allocated_capacity + 1);
  }
  (this->super_JsonFragValReq).super_JsonObjValReq.super_JsonValReq._vptr_JsonValReq =
       (_func_int **)&PTR__JsonDstFragValReq_002fcbf8;
  JsonAnyFullDtValReq::JsonAnyFullDtValReq(anyFullDtValReq);
  return;
}

Assistant:

explicit JsonDstFragValReq() :
        JsonFragValReq {this->typeStr(), {
            nsPropReqEntry(),
            namePropReqEntry(false),
            uidPropReqEntry(false),
            idPropReqEntry(),
            {strs::defCcId, {JsonValReq::shared(JsonVal::Kind::Str)}},
            anyDtPropReqEntry(strs::pktCtxFc, _anyFullDtValReq), //-V1050
            anyDtPropReqEntry(strs::erHeaderFc, _anyFullDtValReq), //-V1050
            anyDtPropReqEntry(strs::erCommonCtxFc, _anyFullDtValReq), //-V1050
        }}
    {
    }